

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,Transform *world_T_base,VectorDynSize *s,Twist *base_velocity,
          VectorDynSize *s_dot,Vector3 *world_gravity)

{
  FrameVelocityRepresentation FVar1;
  KinDynComputationsPrivateAttributes *pKVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  Transform *this_00;
  VectorDynSize *pVVar6;
  Twist *this_01;
  char *pcVar7;
  Rotation base_R_inertial;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_108 [2];
  undefined1 local_d8 [96];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_78 [3];
  
  lVar4 = iDynTree::VectorDynSize::size();
  lVar5 = iDynTree::Model::getNrOfPosCoords();
  if (lVar4 == lVar5) {
    lVar4 = iDynTree::VectorDynSize::size();
    lVar5 = iDynTree::Model::getNrOfDOFs();
    if (lVar4 == lVar5) {
      pKVar2 = this->pimpl;
      pKVar2->m_isFwdKinematicsUpdated = false;
      pKVar2->m_isRawMassMatrixUpdated = false;
      pKVar2->m_areBiasAccelerationsUpdated = false;
      this_00 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::operator=(this_00,world_T_base);
      toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_d8
              ,s);
      pVVar6 = (VectorDynSize *)iDynTree::FreeFloatingPos::jointPos();
      toEigen(local_78,pVVar6);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                (local_78,(Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                           *)local_d8);
      pKVar2 = this->pimpl;
      (pKVar2->m_gravityAcc).m_data[2] = world_gravity->m_data[2];
      dVar3 = world_gravity->m_data[1];
      (pKVar2->m_gravityAcc).m_data[0] = world_gravity->m_data[0];
      (pKVar2->m_gravityAcc).m_data[1] = dVar3;
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::getRotation();
      iDynTree::Rotation::inverse();
      local_d8._16_8_ = &this->pimpl->m_gravityAcc;
      local_108[0]._0_8_ = &this->pimpl->m_gravityAccInBaseLinkFrame;
      local_d8._0_8_ = local_78;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,0>>
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_108,
                 (Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)local_d8);
      toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_d8
              ,s_dot);
      pVVar6 = (VectorDynSize *)iDynTree::FreeFloatingVel::jointVel();
      toEigen(local_108,pVVar6);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                (local_108,
                 (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 local_d8);
      iDynTree::Twist::operator=(&this->pimpl->m_baseVelSetViaRobotState,base_velocity);
      FVar1 = this->pimpl->m_frameVelRepr;
      if (FVar1 == BODY_FIXED_REPRESENTATION) {
        this_01 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
      }
      else {
        if (FVar1 == MIXED_REPRESENTATION) {
          iDynTree::FreeFloatingPos::worldBasePos();
          iDynTree::Transform::getRotation();
          iDynTree::Rotation::inverse();
          iDynTree::Rotation::operator*((Rotation *)local_108,(Twist *)local_d8);
        }
        else {
          iDynTree::FreeFloatingPos::worldBasePos();
          iDynTree::Transform::inverse();
          iDynTree::Transform::operator*((Transform *)local_108,(Twist *)local_d8);
        }
        base_velocity = (Twist *)local_108;
        this_01 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
      }
      iDynTree::Twist::operator=(this_01,base_velocity);
      return true;
    }
    pcVar7 = "Wrong size in input joint velocities";
  }
  else {
    pcVar7 = "Wrong size in input joint positions";
  }
  iDynTree::reportError("KinDynComputations","setRobotState",pcVar7);
  return false;
}

Assistant:

bool KinDynComputations::setRobotState(const Transform& world_T_base,
                                       const VectorDynSize& s,
                                       const Twist& base_velocity,
                                       const VectorDynSize& s_dot,
                                       const Vector3& world_gravity)
{

    bool ok = s.size() == pimpl->m_robot_model.getNrOfPosCoords();
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input joint positions");
        return false;
    }

    ok = s_dot.size() == pimpl->m_robot_model.getNrOfDOFs();
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input joint velocities");
        return false;
    }

    this->invalidateCache();

    // Save pos
    this->pimpl->m_pos.worldBasePos() = world_T_base;
    toEigen(this->pimpl->m_pos.jointPos()) = toEigen(s);

    // Save gravity
    this->pimpl->m_gravityAcc = world_gravity;
    Rotation base_R_inertial = this->pimpl->m_pos.worldBasePos().getRotation().inverse();
    toEigen(pimpl->m_gravityAccInBaseLinkFrame) = toEigen(base_R_inertial)*toEigen(this->pimpl->m_gravityAcc);

    // Save vel
    toEigen(pimpl->m_vel.jointVel()) = toEigen(s_dot);
    this->pimpl->m_baseVelSetViaRobotState = base_velocity;

    // Account for the different possible representations
    if (pimpl->m_frameVelRepr == MIXED_REPRESENTATION)
    {
        pimpl->m_vel.baseVel() = pimpl->m_pos.worldBasePos().getRotation().inverse()*base_velocity;
    }
    else if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        // Data is stored in body fixed
        pimpl->m_vel.baseVel() = base_velocity;
    }
    else
    {
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        // base_X_inertial \ls^inertial v_base
        pimpl->m_vel.baseVel() = pimpl->m_pos.worldBasePos().inverse()*base_velocity;
    }

    return true;
}